

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot-file.c
# Opt level: O1

void faup_snapshot_info_write(char *snapshot_dir)

{
  int iVar1;
  FILE *__s;
  char *info_file;
  time_t current;
  char *local_18;
  time_t local_10;
  
  local_10 = time((time_t *)0x0);
  iVar1 = asprintf(&local_18,"%s%c%s",snapshot_dir,0x2f,"_info");
  if (iVar1 < 0) {
    faup_snapshot_info_write_cold_1();
  }
  else {
    __s = fopen(local_18,"wb+");
    fwrite(&local_10,8,1,__s);
    fclose(__s);
    free(local_18);
  }
  return;
}

Assistant:

void faup_snapshot_info_write(char *snapshot_dir)
{
  FILE *fp;
  time_t current;
  char *info_file;
  int retval;
  
  current = time(NULL);

  retval = asprintf(&info_file, "%s%c%s", snapshot_dir, FAUP_OS_DIRSEP_C, "_info");
  if (retval < 0) {
    fprintf(stderr, "Error: cannot concatenate _info part!\n");
    return;
  }
  fp = fopen(info_file, "wb+");
  fwrite(&current, sizeof(time_t), 1, fp);  
  fclose(fp);

  free(info_file);
}